

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_Select_Test::TestBody(Image_Select_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  WrapMode2D wrapMode_03;
  WrapMode2D wrapMode_04;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i p_03;
  Point2i p_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  Allocator alloc;
  Allocator alloc_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  *this_00;
  Float type;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  int x_1;
  int y_1;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  Image rgImage;
  AssertionResult gtest_ar__1;
  ImageChannelDesc rgDesc;
  AssertionResult gtest_ar_4;
  int x;
  int y;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Image aImage;
  AssertionResult gtest_ar_;
  ImageChannelDesc aDesc;
  Image image;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> pix;
  Point2i res;
  int in_stack_fffffffffffff4b8;
  int in_stack_fffffffffffff4bc;
  Image *in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  WrapMode in_stack_fffffffffffff4cc;
  Float in_stack_fffffffffffff4d0;
  Float in_stack_fffffffffffff4d4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffff4d8;
  undefined7 in_stack_fffffffffffff4e0;
  undefined1 in_stack_fffffffffffff4e7;
  Type in_stack_fffffffffffff4ec;
  allocator<char> *in_stack_fffffffffffff4f0;
  undefined7 in_stack_fffffffffffff4f8;
  undefined1 in_stack_fffffffffffff4ff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff500;
  char *in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff52c;
  char *in_stack_fffffffffffff530;
  undefined7 in_stack_fffffffffffff538;
  undefined1 in_stack_fffffffffffff53f;
  undefined4 in_stack_fffffffffffff540;
  int iVar4;
  WrapMode in_stack_fffffffffffff544;
  WrapMode WVar5;
  WrapMode in_stack_fffffffffffff548;
  WrapMode WVar6;
  int in_stack_fffffffffffff54c;
  int iVar7;
  int in_stack_fffffffffffff550;
  int in_stack_fffffffffffff554;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff558;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffff590;
  Image *in_stack_fffffffffffff598;
  Image *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_t in_stack_fffffffffffff5a8;
  undefined1 *puVar9;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff5b0;
  ImageChannelDesc *in_stack_fffffffffffff5b8;
  undefined7 in_stack_fffffffffffff5c0;
  undefined1 in_stack_fffffffffffff5c7;
  Float in_stack_fffffffffffff5c8;
  Float in_stack_fffffffffffff5cc;
  string *local_978;
  string *local_950;
  AssertionResult local_8b8 [3];
  Float local_888;
  Float local_874;
  AssertionResult local_870;
  int local_860;
  int local_85c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_848;
  AssertionResult local_830 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_810;
  AssertionResult local_7f8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d8;
  size_type local_7c0;
  undefined4 local_7b4;
  AssertionResult local_7b0 [2];
  int local_790;
  undefined4 local_78c;
  AssertionResult local_788 [2];
  Tuple2<pbrt::Point2,_int> local_768;
  Tuple2<pbrt::Point2,_int> local_760;
  AssertionResult local_758;
  Image local_740;
  string local_628 [48];
  AssertionResult local_5f8;
  undefined1 local_5e3;
  undefined1 local_5e2 [2];
  Image *local_5e0;
  undefined1 local_5d8 [64];
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  local_598;
  Float local_514;
  AssertionResult local_510;
  int local_500;
  int local_4fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  AssertionResult local_4d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  size_type local_498;
  undefined4 local_48c;
  AssertionResult local_488 [2];
  int local_468;
  undefined4 local_464;
  AssertionResult local_460 [2];
  Tuple2<pbrt::Point2,_int> local_440;
  Tuple2<pbrt::Point2,_int> local_438;
  AssertionResult local_430;
  Image local_418;
  string local_300 [48];
  AssertionResult local_2d0;
  undefined1 local_2ba;
  allocator<char> local_2b9;
  string *local_2b8;
  string local_2b0 [32];
  string *local_290;
  undefined8 local_288;
  undefined1 local_23d;
  allocator<char> local_23c;
  allocator<char> local_23b;
  allocator<char> local_23a;
  allocator<char> local_239;
  string *local_238;
  string local_230 [32];
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  string *local_1b0;
  undefined8 local_1a8;
  Image local_150;
  int local_10;
  int iStack_c;
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
             in_stack_fffffffffffff4b8);
  GetFloatPixels((Point2i)in_stack_fffffffffffff558,in_stack_fffffffffffff554);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_fffffffffffff4c0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),in_stack_fffffffffffff4d8
             ,(polymorphic_allocator<float> *)
              CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  local_23d = 1;
  local_238 = local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff500,
             (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             in_stack_fffffffffffff4f0);
  local_238 = (string *)local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff500,
             (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             in_stack_fffffffffffff4f0);
  local_238 = (string *)local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff500,
             (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             in_stack_fffffffffffff4f0);
  local_238 = (string *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff500,
             (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             in_stack_fffffffffffff4f0);
  local_23d = 0;
  local_1b0 = local_230;
  local_1a8 = 4;
  v._M_array._4_4_ = in_stack_fffffffffffff4cc;
  v._M_array._0_4_ = in_stack_fffffffffffff4c8;
  v._M_len._0_4_ = in_stack_fffffffffffff4d0;
  v._M_len._4_4_ = in_stack_fffffffffffff4d4;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff4c0,v);
  channels.n = in_stack_fffffffffffff5a8;
  channels.ptr = in_stack_fffffffffffff5a0;
  pbrt::Image::Image(in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                     (Point2i)in_stack_fffffffffffff5b0,channels);
  local_950 = (string *)&local_1b0;
  do {
    local_950 = local_950 + -0x20;
    std::__cxx11::string::~string(local_950);
  } while (local_950 != local_230);
  std::allocator<char>::~allocator(&local_23c);
  std::allocator<char>::~allocator(&local_23b);
  std::allocator<char>::~allocator(&local_23a);
  std::allocator<char>::~allocator(&local_239);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff4c0);
  local_2ba = 1;
  local_2b8 = local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff500,
             (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             in_stack_fffffffffffff4f0);
  local_2ba = 0;
  local_290 = local_2b0;
  local_288 = 1;
  v_00._M_array._4_4_ = in_stack_fffffffffffff4cc;
  v_00._M_array._0_4_ = in_stack_fffffffffffff4c8;
  v_00._M_len._0_4_ = in_stack_fffffffffffff4d0;
  v_00._M_len._4_4_ = in_stack_fffffffffffff4d4;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff4c0,v_00);
  requestedChannels.n = in_stack_fffffffffffff5a8;
  requestedChannels.ptr = in_stack_fffffffffffff5a0;
  pbrt::Image::GetChannelDesc(in_stack_fffffffffffff598,requestedChannels);
  local_978 = (string *)&local_290;
  do {
    local_978 = local_978 + -0x20;
    std::__cxx11::string::~string(local_978);
  } while (local_978 != local_2b0);
  std::allocator<char>::~allocator(&local_2b9);
  pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5ceef9);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff4c0,
             SUB41((uint)in_stack_fffffffffffff4bc >> 0x18,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538),
               in_stack_fffffffffffff530,
               (char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
               in_stack_fffffffffffff520);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (Message *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    std::__cxx11::string::~string(local_300);
    testing::Message::~Message((Message *)0x5cf2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cf31b);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff4c0);
  alloc.memoryResource._4_4_ = in_stack_fffffffffffff5cc;
  alloc.memoryResource._0_4_ = in_stack_fffffffffffff5c8;
  pbrt::Image::SelectChannels
            ((Image *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
             in_stack_fffffffffffff5b8,alloc);
  local_438 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_418);
  local_440 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_150);
  testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (Point2<int> *)in_stack_fffffffffffff4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5cf452);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (Message *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5cf4b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cf50d);
  local_464 = 1;
  local_468 = pbrt::Image::NChannels((Image *)0x5cf525);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (int *)in_stack_fffffffffffff4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5cf5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (Message *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5cf63b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cf693);
  local_48c = 1;
  pbrt::Image::ChannelNames_abi_cxx11_
            ((Image *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
  local_498 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_4b0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (unsigned_long *)in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5cf799);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (Message *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5cf7fc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cf854);
  pbrt::Image::ChannelNames_abi_cxx11_
            ((Image *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_4e8,0);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (char (*) [2])CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5cf945);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (Message *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5cf9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cfa00);
  for (local_4fc = 0; local_4fc < iStack_c; local_4fc = local_4fc + 1) {
    for (local_500 = 0; local_500 < local_10; local_500 = local_500 + 1) {
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
                 in_stack_fffffffffffff4b8);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 in_stack_fffffffffffff4cc);
      p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff550;
      p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff54c;
      wrapMode.wrap.values[1] = in_stack_fffffffffffff548;
      wrapMode.wrap.values[0] = in_stack_fffffffffffff544;
      in_stack_fffffffffffff5cc =
           pbrt::Image::GetChannel
                     ((Image *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538),p,
                      (int)((ulong)in_stack_fffffffffffff530 >> 0x20),wrapMode);
      local_514 = in_stack_fffffffffffff5cc;
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
                 in_stack_fffffffffffff4b8);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 in_stack_fffffffffffff4cc);
      p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff550;
      p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff54c;
      wrapMode_00.wrap.values[1] = in_stack_fffffffffffff548;
      wrapMode_00.wrap.values[0] = in_stack_fffffffffffff544;
      in_stack_fffffffffffff5c8 =
           pbrt::Image::GetChannel
                     ((Image *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538),p_00,
                      (int)((ulong)in_stack_fffffffffffff530 >> 0x20),wrapMode_00);
      local_598._112_4_ = in_stack_fffffffffffff5c8;
      testing::internal::EqHelper<false>::Compare<float,float>
                ((char *)in_stack_fffffffffffff4d8,
                 (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 (float *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                 (float *)in_stack_fffffffffffff4c0);
      in_stack_fffffffffffff5c7 = testing::AssertionResult::operator_cast_to_bool(&local_510);
      if (!(bool)in_stack_fffffffffffff5c7) {
        testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
        in_stack_fffffffffffff5b8 =
             (ImageChannelDesc *)
             testing::AssertionResult::failure_message((AssertionResult *)0x5cfbb4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
                   (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                   (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   (Message *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
        testing::Message::~Message((Message *)0x5cfc17);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cfc6c);
    }
  }
  local_5e3 = 1;
  puVar9 = local_5d8;
  local_5e0 = (Image *)puVar9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff500,
             (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             in_stack_fffffffffffff4f0);
  this_01 = (Image *)(local_5d8 + 0x20);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e2;
  local_5e0 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff500,
             (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             in_stack_fffffffffffff4f0);
  local_5e3 = 0;
  local_598._0_8_ = local_5d8;
  local_598.fixed[0]._M_string_length = 2;
  v_01._M_array._4_4_ = in_stack_fffffffffffff4cc;
  v_01._M_array._0_4_ = in_stack_fffffffffffff4c8;
  v_01._M_len._0_4_ = in_stack_fffffffffffff4d0;
  v_01._M_len._4_4_ = in_stack_fffffffffffff4d4;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff4c0,v_01);
  requestedChannels_00.n = (size_t)puVar9;
  requestedChannels_00.ptr = pbVar8;
  pbrt::Image::GetChannelDesc(this_01,requestedChannels_00);
  this_00 = &local_598;
  do {
    this_00 = (anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
               *)((long)this_00 + -0x20);
    std::__cxx11::string::~string((string *)this_00->fixed);
  } while (this_00 !=
           (anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
            *)local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)local_5e2);
  std::allocator<char>::~allocator((allocator<char> *)(local_5e2 + 1));
  pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5cfe2d);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff4c0,
             SUB41((uint)in_stack_fffffffffffff4bc >> 0x18,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538),
               in_stack_fffffffffffff530,
               (char *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
               in_stack_fffffffffffff520);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (Message *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    std::__cxx11::string::~string(local_628);
    testing::Message::~Message((Message *)0x5d006f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d00ea);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff4c0);
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffff5cc;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffff5c8;
  pbrt::Image::SelectChannels
            ((Image *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
             in_stack_fffffffffffff5b8,alloc_00);
  local_760 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_740);
  WVar6 = local_760.x;
  iVar7 = local_760.y;
  local_768 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_150);
  iVar4 = local_768.x;
  WVar5 = local_768.y;
  testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (Point2<int> *)in_stack_fffffffffffff4c0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_758);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    in_stack_fffffffffffff530 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5d0221);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(WVar5,iVar4),
               (Message *)CONCAT17(uVar2,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5d027e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d02d6);
  local_78c = 2;
  local_790 = pbrt::Image::NChannels((Image *)0x5d02ee);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (int *)in_stack_fffffffffffff4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_788);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5d0395);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(WVar5,iVar4),
               (Message *)CONCAT17(uVar2,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5d03f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d044a);
  local_7b4 = 2;
  pbrt::Image::ChannelNames_abi_cxx11_
            ((Image *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
  local_7c0 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_7d8);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (unsigned_long *)in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5d054a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(WVar5,iVar4),
               (Message *)CONCAT17(uVar2,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5d05a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d05ff);
  pbrt::Image::ChannelNames_abi_cxx11_
            ((Image *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_810,0);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (char (*) [2])CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5d06ea);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(WVar5,iVar4),
               (Message *)CONCAT17(uVar2,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5d0747);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d079f);
  pbrt::Image::ChannelNames_abi_cxx11_
            ((Image *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_848,1);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff4d8,
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (char (*) [2])CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_830);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
    in_stack_fffffffffffff4f0 =
         (allocator<char> *)testing::AssertionResult::failure_message((AssertionResult *)0x5d088b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4ec,
               (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
               (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(WVar5,iVar4),
               (Message *)CONCAT17(uVar2,in_stack_fffffffffffff538));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
    testing::Message::~Message((Message *)0x5d08e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d0940);
  for (local_85c = 0; local_85c < iStack_c; local_85c = local_85c + 1) {
    for (local_860 = 0; local_860 < local_10; local_860 = local_860 + 1) {
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
                 in_stack_fffffffffffff4b8);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 in_stack_fffffffffffff4cc);
      p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff550;
      p_01.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
      wrapMode_01.wrap.values[1] = WVar6;
      wrapMode_01.wrap.values[0] = WVar5;
      type = pbrt::Image::GetChannel
                       ((Image *)CONCAT17(uVar2,in_stack_fffffffffffff538),p_01,
                        (int)((ulong)in_stack_fffffffffffff530 >> 0x20),wrapMode_01);
      local_874 = type;
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
                 in_stack_fffffffffffff4b8);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 in_stack_fffffffffffff4cc);
      p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff550;
      p_02.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
      wrapMode_02.wrap.values[1] = WVar6;
      wrapMode_02.wrap.values[0] = WVar5;
      local_888 = pbrt::Image::GetChannel
                            ((Image *)CONCAT17(uVar2,in_stack_fffffffffffff538),p_02,
                             (int)((ulong)in_stack_fffffffffffff530 >> 0x20),wrapMode_02);
      testing::internal::EqHelper<false>::Compare<float,float>
                ((char *)in_stack_fffffffffffff4d8,
                 (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 (float *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                 (float *)in_stack_fffffffffffff4c0);
      uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_870);
      if (!(bool)uVar3) {
        testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
        in_stack_fffffffffffff4d8 =
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x5d0ae5);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff4f0,(Type)type,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffff4e0),
                   (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(WVar5,iVar4),
                   (Message *)CONCAT17(uVar2,in_stack_fffffffffffff538));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
        testing::Message::~Message((Message *)0x5d0b42);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d0b9a);
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
                 in_stack_fffffffffffff4b8);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 in_stack_fffffffffffff4cc);
      p_03.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff550;
      p_03.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
      wrapMode_03.wrap.values[1] = WVar6;
      wrapMode_03.wrap.values[0] = WVar5;
      in_stack_fffffffffffff4d4 =
           pbrt::Image::GetChannel
                     ((Image *)CONCAT17(uVar2,in_stack_fffffffffffff538),p_03,
                      (int)((ulong)in_stack_fffffffffffff530 >> 0x20),wrapMode_03);
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
                 in_stack_fffffffffffff4b8);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 in_stack_fffffffffffff4cc);
      p_04.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff550;
      p_04.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
      wrapMode_04.wrap.values[1] = WVar6;
      wrapMode_04.wrap.values[0] = WVar5;
      in_stack_fffffffffffff4d0 =
           pbrt::Image::GetChannel
                     ((Image *)CONCAT17(uVar2,in_stack_fffffffffffff538),p_04,
                      (int)((ulong)in_stack_fffffffffffff530 >> 0x20),wrapMode_04);
      testing::internal::EqHelper<false>::Compare<float,float>
                ((char *)in_stack_fffffffffffff4d8,
                 (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 (float *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                 (float *)in_stack_fffffffffffff4c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8b8);
      in_stack_fffffffffffff4cc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff4cc);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff4f0);
        in_stack_fffffffffffff4c0 =
             (Image *)testing::AssertionResult::failure_message((AssertionResult *)0x5d0d04);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff4f0,(Type)type,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffff4e0),
                   (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(WVar5,iVar4),
                   (Message *)CONCAT17(uVar2,in_stack_fffffffffffff538));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4c0);
        testing::Message::~Message((Message *)0x5d0d61);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d0db6);
    }
  }
  pbrt::Image::~Image(in_stack_fffffffffffff4c0);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5d0e0d);
  pbrt::Image::~Image(in_stack_fffffffffffff4c0);
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5d0e27);
  pbrt::Image::~Image(in_stack_fffffffffffff4c0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff4c0);
  return;
}

Assistant:

TEST(Image, Select) {
    Point2i res(4, 9);
    pstd::vector<float> pix = GetFloatPixels(res, 4);
    Image image(pix, res, {"A", "B", "G", "R"});

    auto aDesc = image.GetChannelDesc({"A"});
    EXPECT_TRUE(bool(aDesc));
    Image aImage = image.SelectChannels(aDesc);

    EXPECT_EQ(aImage.Resolution(), image.Resolution());
    EXPECT_EQ(1, aImage.NChannels());
    EXPECT_EQ(1, aImage.ChannelNames().size());
    EXPECT_EQ("A", aImage.ChannelNames()[0]);
    for (int y = 0; y < res.y; ++y)
        for (int x = 0; x < res.x; ++x)
            EXPECT_EQ(aImage.GetChannel({x, y}, 0), image.GetChannel({x, y}, 0));

    auto rgDesc = image.GetChannelDesc({"R", "G"});
    EXPECT_TRUE(bool(rgDesc));
    Image rgImage = image.SelectChannels(rgDesc);
    EXPECT_EQ(rgImage.Resolution(), image.Resolution());
    EXPECT_EQ(2, rgImage.NChannels());
    EXPECT_EQ(2, rgImage.ChannelNames().size());
    EXPECT_EQ("R", rgImage.ChannelNames()[0]);
    EXPECT_EQ("G", rgImage.ChannelNames()[1]);
    for (int y = 0; y < res.y; ++y)
        for (int x = 0; x < res.x; ++x) {
            EXPECT_EQ(rgImage.GetChannel({x, y}, 0), image.GetChannel({x, y}, 3));
            EXPECT_EQ(rgImage.GetChannel({x, y}, 1), image.GetChannel({x, y}, 2));
        }
}